

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_set_all_gej_var(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  uint64_t uVar124;
  uint64_t uVar125;
  size_t sVar126;
  int *piVar127;
  ulong uVar128;
  secp256k1_fe *b;
  ulong uVar129;
  ulong uVar130;
  uint64_t *puVar131;
  uint64_t uVar132;
  secp256k1_ge *r_00;
  size_t sVar133;
  secp256k1_fe local_88;
  size_t local_60;
  undefined1 local_58 [16];
  uint64_t *local_48;
  int *local_40;
  size_t local_38;
  
  if (len == 0) {
    sVar126 = 0xffffffffffffffff;
  }
  else {
    b = &a->z;
    sVar126 = 0xffffffffffffffff;
    sVar133 = 0;
    r_00 = r;
    do {
      if (*(int *)(b + 1) == 0) {
        if (sVar126 == 0xffffffffffffffff) {
          (r_00->x).n[4] = b->n[4];
          uVar132 = b->n[0];
          uVar124 = b->n[1];
          uVar125 = b->n[3];
          (r_00->x).n[2] = b->n[2];
          (r_00->x).n[3] = uVar125;
          (r_00->x).n[0] = uVar132;
          (r_00->x).n[1] = uVar124;
          sVar126 = sVar133;
        }
        else {
          secp256k1_fe_impl_mul(&r_00->x,&r[sVar126].x,b);
          sVar126 = sVar133;
        }
      }
      else {
        r_00->infinity = 1;
        (r_00->x).n[0] = 0;
        (r_00->x).n[1] = 0;
        (r_00->x).n[2] = 0;
        (r_00->x).n[3] = 0;
        (r_00->x).n[4] = 0;
        (r_00->y).n[0] = 0;
        (r_00->y).n[1] = 0;
        (r_00->y).n[2] = 0;
        (r_00->y).n[3] = 0;
        (r_00->y).n[4] = 0;
      }
      sVar133 = sVar133 + 1;
      r_00 = r_00 + 1;
      b = (secp256k1_fe *)(b[3].n + 1);
    } while (len != sVar133);
  }
  if (sVar126 != 0xffffffffffffffff) {
    secp256k1_fe_impl_inv_var(&local_88,&r[sVar126].x);
    if (sVar126 != 0) {
      piVar127 = &a[sVar126 - 1].infinity;
      puVar131 = r[sVar126 - 1].x.n + 4;
      uVar132 = local_88.n[0];
      sVar133 = sVar126;
      do {
        sVar133 = sVar133 - 1;
        local_88.n[0] = uVar132;
        if (*piVar127 == 0) {
          uVar129 = ((secp256k1_fe *)(puVar131 + -4))->n[0];
          uVar1 = puVar131[-3];
          uVar2 = puVar131[-2];
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_88.n[3];
          auVar66._8_8_ = 0;
          auVar66._0_8_ = uVar129;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_88.n[2];
          auVar67._8_8_ = 0;
          auVar67._0_8_ = uVar1;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_88.n[1];
          auVar68._8_8_ = 0;
          auVar68._0_8_ = uVar2;
          uVar3 = puVar131[-1];
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar132;
          auVar69._8_8_ = 0;
          auVar69._0_8_ = uVar3;
          uVar4 = *puVar131;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_88.n[4];
          auVar70._8_8_ = 0;
          auVar70._0_8_ = uVar4;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = SUB168(auVar9 * auVar70,0);
          auVar8 = auVar6 * auVar67 + auVar5 * auVar66 + auVar7 * auVar68 + auVar8 * auVar69 +
                   auVar10 * ZEXT816(0x1000003d10);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_88.n[4];
          auVar71._8_8_ = 0;
          auVar71._0_8_ = uVar129;
          local_58._8_8_ = 0;
          local_58._0_8_ = local_88.n[3];
          auVar72._8_8_ = 0;
          auVar72._0_8_ = uVar1;
          local_58 = local_58 * auVar72;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_88.n[2];
          auVar73._8_8_ = 0;
          auVar73._0_8_ = uVar2;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_88.n[1];
          auVar74._8_8_ = 0;
          auVar74._0_8_ = uVar3;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar132;
          auVar75._8_8_ = 0;
          auVar75._0_8_ = uVar4;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = SUB168(auVar9 * auVar70,8);
          auVar5 = auVar15 * ZEXT816(0x1000003d10000) +
                   auVar11 * auVar71 +
                   auVar14 * auVar75 + auVar13 * auVar74 + auVar12 * auVar73 + local_58 +
                   (auVar8 >> 0x34);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = uVar132;
          auVar76._8_8_ = 0;
          auVar76._0_8_ = uVar129;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_88.n[4];
          auVar77._8_8_ = 0;
          auVar77._0_8_ = uVar1;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_88.n[3];
          auVar78._8_8_ = 0;
          auVar78._0_8_ = uVar2;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_88.n[2];
          auVar79._8_8_ = 0;
          auVar79._0_8_ = uVar3;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_88.n[1];
          auVar80._8_8_ = 0;
          auVar80._0_8_ = uVar4;
          auVar6 = (auVar5 >> 0x34) +
                   auVar20 * auVar80 + auVar19 * auVar79 + auVar18 * auVar78 + auVar17 * auVar77;
          uVar128 = auVar6._0_8_;
          uVar130 = auVar6._8_8_;
          auVar119._8_8_ = uVar130 >> 0x34;
          auVar119._0_8_ = uVar130 * 0x1000 | uVar128 >> 0x34;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = uVar128 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar5._6_2_ & 0xf);
          auVar6 = auVar16 * auVar76 + auVar21 * ZEXT816(0x1000003d1);
          uVar128 = auVar6._0_8_;
          uVar130 = auVar6._8_8_;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = local_88.n[1];
          auVar81._8_8_ = 0;
          auVar81._0_8_ = uVar129;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar132;
          auVar82._8_8_ = 0;
          auVar82._0_8_ = uVar1;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = local_88.n[4];
          auVar83._8_8_ = 0;
          auVar83._0_8_ = uVar2;
          auVar116._8_8_ = uVar130 >> 0x34;
          auVar116._0_8_ = uVar130 * 0x1000 | uVar128 >> 0x34;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_88.n[3];
          auVar84._8_8_ = 0;
          auVar84._0_8_ = uVar3;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = local_88.n[2];
          auVar85._8_8_ = 0;
          auVar85._0_8_ = uVar4;
          auVar119 = auVar24 * auVar83 + auVar26 * auVar85 + auVar25 * auVar84 + auVar119;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = auVar119._0_8_ & 0xfffffffffffff;
          auVar116 = auVar27 * ZEXT816(0x1000003d10) + auVar23 * auVar82 + auVar22 * auVar81 +
                     auVar116;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = local_88.n[2];
          auVar86._8_8_ = 0;
          auVar86._0_8_ = uVar129;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_88.n[1];
          auVar87._8_8_ = 0;
          auVar87._0_8_ = uVar1;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar132;
          auVar88._8_8_ = 0;
          auVar88._0_8_ = uVar2;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = local_88.n[4];
          auVar89._8_8_ = 0;
          auVar89._0_8_ = uVar3;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_88.n[3];
          auVar90._8_8_ = 0;
          auVar90._0_8_ = uVar4;
          auVar6 = auVar32 * auVar90 + auVar31 * auVar89 + (auVar119 >> 0x34);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = auVar6._0_8_;
          auVar7 = auVar33 * ZEXT816(0x1000003d10) +
                   auVar30 * auVar88 + auVar29 * auVar87 + auVar28 * auVar86 + (auVar116 >> 0x34);
          r[sVar126].x.n[0] = uVar128 & 0xfffffffffffff;
          auVar9 = auVar7 >> 0x34;
          auVar121._8_8_ = 0;
          auVar121._0_8_ = auVar9._0_8_;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = auVar6._8_8_;
          auVar120._8_8_ = auVar9._8_8_;
          auVar120._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
          r[sVar126].x.n[1] = auVar116._0_8_ & 0xfffffffffffff;
          auVar121 = auVar34 * ZEXT816(0x1000003d10000) + auVar120 + auVar121;
          uVar129 = auVar121._0_8_;
          r[sVar126].x.n[2] = auVar7._0_8_ & 0xfffffffffffff;
          r[sVar126].x.n[3] = uVar129 & 0xfffffffffffff;
          r[sVar126].x.n[4] =
               (auVar121._8_8_ << 0xc | uVar129 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
          uVar129 = a[sVar126].z.n[3];
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar129;
          auVar91._8_8_ = 0;
          auVar91._0_8_ = uVar132;
          uVar1 = a[sVar126].z.n[2];
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar1;
          auVar92._8_8_ = 0;
          auVar92._0_8_ = local_88.n[1];
          uVar2 = a[sVar126].z.n[1];
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar2;
          auVar93._8_8_ = 0;
          auVar93._0_8_ = local_88.n[2];
          uVar3 = a[sVar126].z.n[0];
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar3;
          auVar94._8_8_ = 0;
          auVar94._0_8_ = local_88.n[3];
          uVar4 = a[sVar126].z.n[4];
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar4;
          auVar95._8_8_ = 0;
          auVar95._0_8_ = local_88.n[4];
          auVar40._8_8_ = 0;
          auVar40._0_8_ = SUB168(auVar39 * auVar95,0);
          auVar8 = auVar36 * auVar92 + auVar35 * auVar91 + auVar37 * auVar93 + auVar38 * auVar94 +
                   auVar40 * ZEXT816(0x1000003d10);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar4;
          auVar96._8_8_ = 0;
          auVar96._0_8_ = uVar132;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar129;
          auVar97._8_8_ = 0;
          auVar97._0_8_ = local_88.n[1];
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar1;
          auVar98._8_8_ = 0;
          auVar98._0_8_ = local_88.n[2];
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar2;
          auVar99._8_8_ = 0;
          auVar99._0_8_ = local_88.n[3];
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar3;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = local_88.n[4];
          auVar46._8_8_ = 0;
          auVar46._0_8_ = SUB168(auVar39 * auVar95,8);
          auVar5 = auVar46 * ZEXT816(0x1000003d10000) +
                   auVar41 * auVar96 +
                   auVar45 * auVar100 + auVar44 * auVar99 + auVar43 * auVar98 + auVar42 * auVar97 +
                   (auVar8 >> 0x34);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar3;
          auVar101._8_8_ = 0;
          auVar101._0_8_ = uVar132;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar4;
          auVar102._8_8_ = 0;
          auVar102._0_8_ = local_88.n[1];
          auVar49._8_8_ = 0;
          auVar49._0_8_ = uVar129;
          auVar103._8_8_ = 0;
          auVar103._0_8_ = local_88.n[2];
          auVar50._8_8_ = 0;
          auVar50._0_8_ = uVar1;
          auVar104._8_8_ = 0;
          auVar104._0_8_ = local_88.n[3];
          auVar51._8_8_ = 0;
          auVar51._0_8_ = uVar2;
          auVar105._8_8_ = 0;
          auVar105._0_8_ = local_88.n[4];
          auVar6 = (auVar5 >> 0x34) +
                   auVar51 * auVar105 + auVar50 * auVar104 + auVar49 * auVar103 + auVar48 * auVar102
          ;
          uVar128 = auVar6._0_8_;
          uVar130 = auVar6._8_8_;
          auVar117._8_8_ = uVar130 >> 0x34;
          auVar117._0_8_ = uVar130 * 0x1000 | uVar128 >> 0x34;
          auVar52._8_8_ = 0;
          auVar52._0_8_ = uVar128 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar5._6_2_ & 0xf);
          auVar6 = auVar47 * auVar101 + auVar52 * ZEXT816(0x1000003d1);
          local_88.n[0] = auVar6._0_8_;
          uVar128 = auVar6._8_8_;
          auVar118._8_8_ = uVar128 >> 0x34;
          auVar118._0_8_ = uVar128 * 0x1000 | local_88.n[0] >> 0x34;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = uVar2;
          auVar106._8_8_ = 0;
          auVar106._0_8_ = uVar132;
          auVar54._8_8_ = 0;
          auVar54._0_8_ = uVar3;
          auVar107._8_8_ = 0;
          auVar107._0_8_ = local_88.n[1];
          auVar55._8_8_ = 0;
          auVar55._0_8_ = uVar4;
          auVar108._8_8_ = 0;
          auVar108._0_8_ = local_88.n[2];
          local_88.n[0] = local_88.n[0] & 0xfffffffffffff;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = uVar129;
          auVar109._8_8_ = 0;
          auVar109._0_8_ = local_88.n[3];
          auVar57._8_8_ = 0;
          auVar57._0_8_ = uVar1;
          auVar110._8_8_ = 0;
          auVar110._0_8_ = local_88.n[4];
          auVar117 = auVar55 * auVar108 + auVar57 * auVar110 + auVar56 * auVar109 + auVar117;
          auVar58._8_8_ = 0;
          auVar58._0_8_ = auVar117._0_8_ & 0xfffffffffffff;
          auVar118 = auVar58 * ZEXT816(0x1000003d10) + auVar54 * auVar107 + auVar53 * auVar106 +
                     auVar118;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar1;
          auVar111._8_8_ = 0;
          auVar111._0_8_ = uVar132;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = uVar2;
          auVar112._8_8_ = 0;
          auVar112._0_8_ = local_88.n[1];
          auVar61._8_8_ = 0;
          auVar61._0_8_ = uVar3;
          auVar113._8_8_ = 0;
          auVar113._0_8_ = local_88.n[2];
          local_88.n[1] = auVar118._0_8_ & 0xfffffffffffff;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uVar4;
          auVar114._8_8_ = 0;
          auVar114._0_8_ = local_88.n[3];
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uVar129;
          auVar115._8_8_ = 0;
          auVar115._0_8_ = local_88.n[4];
          auVar6 = auVar63 * auVar115 + auVar62 * auVar114 + (auVar117 >> 0x34);
          auVar64._8_8_ = 0;
          auVar64._0_8_ = auVar6._0_8_;
          auVar7 = auVar64 * ZEXT816(0x1000003d10) +
                   auVar61 * auVar113 + auVar59 * auVar111 + auVar60 * auVar112 + (auVar118 >> 0x34)
          ;
          auVar9 = auVar7 >> 0x34;
          auVar123._8_8_ = 0;
          auVar123._0_8_ = auVar9._0_8_;
          auVar65._8_8_ = 0;
          auVar65._0_8_ = auVar6._8_8_;
          local_88.n[2] = auVar7._0_8_ & 0xfffffffffffff;
          auVar122._8_8_ = auVar9._8_8_;
          auVar122._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
          auVar123 = auVar65 * ZEXT816(0x1000003d10000) + auVar122 + auVar123;
          uVar129 = auVar123._0_8_;
          local_88.n[3] = uVar129 & 0xfffffffffffff;
          local_88.n[4] =
               (auVar123._8_8_ << 0xc | uVar129 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
          sVar126 = sVar133;
          local_48 = puVar131;
          local_40 = piVar127;
          local_38 = sVar133;
        }
        piVar127 = piVar127 + -0x20;
        puVar131 = puVar131 + -0xb;
        uVar132 = local_88.n[0];
        local_60 = len;
      } while (sVar133 != 0);
    }
    r[sVar126].x.n[4] = local_88.n[4];
    puVar131 = r[sVar126].x.n + 2;
    *puVar131 = local_88.n[2];
    puVar131[1] = local_88.n[3];
    r[sVar126].x.n[0] = local_88.n[0];
    r[sVar126].x.n[1] = local_88.n[1];
    if (len != 0) {
      do {
        if (a->infinity == 0) {
          secp256k1_ge_set_gej_zinv(r,a,&r->x);
        }
        r = r + 1;
        a = a + 1;
        len = len - 1;
      } while (len != 0);
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej_var(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
    size_t last_i = SIZE_MAX;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
    }
#endif

    for (i = 0; i < len; i++) {
        if (a[i].infinity) {
            secp256k1_ge_set_infinity(&r[i]);
        } else {
            /* Use destination's x coordinates as scratch space */
            if (last_i == SIZE_MAX) {
                r[i].x = a[i].z;
            } else {
                secp256k1_fe_mul(&r[i].x, &r[last_i].x, &a[i].z);
            }
            last_i = i;
        }
    }
    if (last_i == SIZE_MAX) {
        return;
    }
    secp256k1_fe_inv_var(&u, &r[last_i].x);

    i = last_i;
    while (i > 0) {
        i--;
        if (!a[i].infinity) {
            secp256k1_fe_mul(&r[last_i].x, &r[i].x, &u);
            secp256k1_fe_mul(&u, &u, &a[last_i].z);
            last_i = i;
        }
    }
    VERIFY_CHECK(!a[last_i].infinity);
    r[last_i].x = u;

    for (i = 0; i < len; i++) {
        if (!a[i].infinity) {
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}